

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O0

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::ParenthesisOperator> *op)

{
  bool bVar1;
  element_type *peVar2;
  Visitor<__int128> *in_RDI;
  shared_ptr<const_calc4::Operator> *item;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  *__range4;
  int variableNo;
  ostream *in_stack_ffffffffffffff98;
  ostream *in_stack_ffffffffffffffa0;
  _Optional_payload_base<int> in_stack_ffffffffffffffb0;
  VariableName local_44;
  Visitor<__int128> *in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::shared_ptr<const_calc4::Operator>_*,_std::vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>_>
  local_30;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  *local_28;
  int local_20;
  optional<int> local_18 [3];
  
  peVar2 = std::
           __shared_ptr_access<const_calc4::ParenthesisOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::ParenthesisOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x138392);
  ParenthesisOperator::GetOperators(peVar2);
  bVar1 = std::
          vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
          ::empty((vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                   *)in_stack_ffffffffffffffb0);
  if (bVar1) {
    AppendVariableDeclarationBegin(in_stack_ffffffffffffffc0);
    std::operator<<(in_RDI->os,'0');
    AppendVariableDeclarationEnd((Visitor<__int128> *)0x1383cf);
    std::optional<int>::optional(local_18);
    Return(in_RDI,(optional<int>)in_stack_ffffffffffffffb0);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<const_calc4::ParenthesisOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_calc4::ParenthesisOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1383f7);
    local_28 = ParenthesisOperator::GetOperators(peVar2);
    local_30._M_current =
         (shared_ptr<const_calc4::Operator> *)
         std::
         vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
         ::begin((vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                  *)in_stack_ffffffffffffff98);
    std::
    vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
    ::end((vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
           *)in_stack_ffffffffffffff98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::shared_ptr<const_calc4::Operator>_*,_std::vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>_>
                          *)in_stack_ffffffffffffffa0,
                         (__normal_iterator<const_std::shared_ptr<const_calc4::Operator>_*,_std::vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>_>
                          *)in_stack_ffffffffffffff98);
      if (!bVar1) break;
      in_stack_ffffffffffffffc0 =
           (Visitor<__int128> *)
           __gnu_cxx::
           __normal_iterator<const_std::shared_ptr<const_calc4::Operator>_*,_std::vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>_>
           ::operator*(&local_30);
      local_20 = ProcessOperator((Visitor<__int128> *)in_stack_ffffffffffffffb0,
                                 (shared_ptr<const_calc4::Operator> *)in_RDI);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<const_calc4::Operator>_*,_std::vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>_>
      ::operator++(&local_30);
    }
    if (-1 < local_20) {
      AppendVariableDeclarationBegin(in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffa0 = in_RDI->os;
      VariableName::VariableName(&local_44,local_20);
      anon_unknown_0::operator<<
                (in_stack_ffffffffffffff98,
                 (VariableName)(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      AppendVariableDeclarationEnd((Visitor<__int128> *)0x1384aa);
    }
    std::optional<int>::optional<int_&,_true>
              ((optional<int> *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    Return(in_RDI,(optional<int>)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const ParenthesisOperator>& op) override
    {
        if (op->GetOperators().empty())
        {
            AppendVariableDeclarationBegin();
            os << '0';
            AppendVariableDeclarationEnd();
            Return();
        }
        else
        {
            int variableNo;

            for (auto& item : op->GetOperators())
            {
                variableNo = ProcessOperator(item);
            }

            if (variableNo >= 0)
            {
                AppendVariableDeclarationBegin();
                os << VariableName(variableNo);
                AppendVariableDeclarationEnd();
            }

            Return(variableNo);
        }
    }